

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O0

Aig_Obj_t * Aig_ObjCreateGhost(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1,Aig_Type_t Type)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pGhost;
  Aig_Type_t Type_local;
  Aig_Obj_t *p1_local;
  Aig_Obj_t *p0_local;
  Aig_Man_t *p_local;
  
  if (Type == AIG_OBJ_AND) {
    pAVar2 = Aig_Regular(p0);
    iVar1 = Aig_ObjIsConst1(pAVar2);
    if (iVar1 != 0) {
      __assert_fail("Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                    ,0x15d,
                    "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                   );
    }
  }
  if (p1 != (Aig_Obj_t *)0x0) {
    pAVar2 = Aig_Regular(p1);
    iVar1 = Aig_ObjIsConst1(pAVar2);
    if (iVar1 != 0) {
      __assert_fail("p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                    ,0x15e,
                    "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                   );
    }
  }
  if (Type != AIG_OBJ_CI) {
    pAVar2 = Aig_Regular(p0);
    pAVar3 = Aig_Regular(p1);
    if (pAVar2 == pAVar3) {
      __assert_fail("Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                    ,0x15f,
                    "Aig_Obj_t *Aig_ObjCreateGhost(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)"
                   );
    }
  }
  pAVar2 = Aig_ManGhost(p);
  *(ulong *)&pAVar2->field_0x18 =
       *(ulong *)&pAVar2->field_0x18 & 0xfffffffffffffff8 | (ulong)Type & 7;
  if (p1 != (Aig_Obj_t *)0x0) {
    pAVar3 = Aig_Regular(p0);
    iVar1 = pAVar3->Id;
    pAVar3 = Aig_Regular(p1);
    if (pAVar3->Id <= iVar1) {
      pAVar2->pFanin0 = p1;
      pAVar2->pFanin1 = p0;
      return pAVar2;
    }
  }
  pAVar2->pFanin0 = p0;
  pAVar2->pFanin1 = p1;
  return pAVar2;
}

Assistant:

static inline Aig_Obj_t *  Aig_ObjCreateGhost( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1, Aig_Type_t Type )    
{
    Aig_Obj_t * pGhost;
    assert( Type != AIG_OBJ_AND || !Aig_ObjIsConst1(Aig_Regular(p0)) );
    assert( p1 == NULL || !Aig_ObjIsConst1(Aig_Regular(p1)) );
    assert( Type == AIG_OBJ_CI || Aig_Regular(p0) != Aig_Regular(p1) );
    pGhost = Aig_ManGhost(p);
    pGhost->Type = Type;
    if ( p1 == NULL || Aig_Regular(p0)->Id < Aig_Regular(p1)->Id )
    {
        pGhost->pFanin0 = p0;
        pGhost->pFanin1 = p1;
    }
    else
    {
        pGhost->pFanin0 = p1;
        pGhost->pFanin1 = p0;
    }
    return pGhost;
}